

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  connectdata *conn_00;
  IMAP *pIVar1;
  IMAP *imap;
  connectdata *conn;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if (status == CURLE_OK) {
      if ((((*(ulong *)&(data->set).field_0x894 & 1) == 0) && (pIVar1->custom == (char *)0x0)) &&
         ((pIVar1->uid != (char *)0x0 ||
          (((pIVar1->mindex != (char *)0x0 ||
            ((*(uint *)&(data->state).field_0x7be >> 0x13 & 1) != 0)) ||
           ((data->set).mimepost.kind != MIMEKIND_NONE)))))) {
        if (((*(uint *)&(data->state).field_0x7be >> 0x13 & 1) == 0) &&
           ((data->set).mimepost.kind == MIMEKIND_NONE)) {
          imap_state(data,IMAP_FETCH_FINAL);
        }
        else {
          conn._4_4_ = Curl_pp_sendf(data,&(conn_00->proto).ftpc.pp,"%s","");
          if (conn._4_4_ == CURLE_OK) {
            imap_state(data,IMAP_APPEND_FINAL);
          }
        }
        if (conn._4_4_ == CURLE_OK) {
          conn._4_4_ = imap_block_statemach(data,conn_00,false);
        }
      }
    }
    else {
      Curl_conncontrol(conn_00,1);
      conn._4_4_ = status;
    }
    (*Curl_cfree)(pIVar1->mailbox);
    pIVar1->mailbox = (char *)0x0;
    (*Curl_cfree)(pIVar1->uidvalidity);
    pIVar1->uidvalidity = (char *)0x0;
    (*Curl_cfree)(pIVar1->uid);
    pIVar1->uid = (char *)0x0;
    (*Curl_cfree)(pIVar1->mindex);
    pIVar1->mindex = (char *)0x0;
    (*Curl_cfree)(pIVar1->section);
    pIVar1->section = (char *)0x0;
    (*Curl_cfree)(pIVar1->partial);
    pIVar1->partial = (char *)0x0;
    (*Curl_cfree)(pIVar1->query);
    pIVar1->query = (char *)0x0;
    (*Curl_cfree)(pIVar1->custom);
    pIVar1->custom = (char *)0x0;
    (*Curl_cfree)(pIVar1->custom_params);
    pIVar1->custom_params = (char *)0x0;
    pIVar1->transfer = PPTRANSFER_BODY;
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct IMAP *imap = data->req.p.imap;

  (void)premature;

  if(!imap)
    return CURLE_OK;

  if(status) {
    connclose(conn, "IMAP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && !imap->custom &&
          (imap->uid || imap->mindex || data->state.upload ||
          IS_MIME_POST(data))) {
    /* Handle responses after FETCH or APPEND transfer has finished */

    if(!data->state.upload && !IS_MIME_POST(data))
      imap_state(data, IMAP_FETCH_FINAL);
    else {
      /* End the APPEND command first by sending an empty line */
      result = Curl_pp_sendf(data, &conn->proto.imapc.pp, "%s", "");
      if(!result)
        imap_state(data, IMAP_APPEND_FINAL);
    }

    /* Run the state-machine */
    if(!result)
      result = imap_block_statemach(data, conn, FALSE);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(imap->mailbox);
  Curl_safefree(imap->uidvalidity);
  Curl_safefree(imap->uid);
  Curl_safefree(imap->mindex);
  Curl_safefree(imap->section);
  Curl_safefree(imap->partial);
  Curl_safefree(imap->query);
  Curl_safefree(imap->custom);
  Curl_safefree(imap->custom_params);

  /* Clear the transfer mode for the next request */
  imap->transfer = PPTRANSFER_BODY;

  return result;
}